

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

HelicsDataBuffer helicsInputGetDataBuffer(HelicsInput inp,HelicsError *err)

{
  InputObject *pIVar1;
  SmallBuffer *this;
  HelicsDataBuffer pvVar2;
  data_view bytes;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  pIVar1 = anon_unknown.dwarf_694c0::verifyInput(inp,err);
  if (pIVar1 == (InputObject *)0x0) {
    pvVar2 = (HelicsDataBuffer)0x0;
  }
  else {
    helics::Input::getBytes(&bytes,pIVar1->inputPtr);
    this = (SmallBuffer *)operator_new(0x60);
    local_20._M_len = bytes.dblock._M_len;
    local_20._M_str = bytes.dblock._M_str;
    helics::SmallBuffer::SmallBuffer<std::basic_string_view<char,std::char_traits<char>>,void>
              (this,&local_20);
    pvVar2 = createAPIDataBuffer(this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&bytes.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return pvVar2;
}

Assistant:

HelicsDataBuffer helicsInputGetDataBuffer(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return (nullptr);
    }
    const helics::data_view bytes = inpObj->inputPtr->getBytes();
    auto* ptr = new helics::SmallBuffer(bytes.string_view());
    return createAPIDataBuffer(*ptr);
}